

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLNodeLaplacian_misc.cpp
# Opt level: O2

void __thiscall
amrex::MLNodeLaplacian::Fapply
          (MLNodeLaplacian *this,int amrlev,int mglev,MultiFab *out,MultiFab *in)

{
  int iVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  uint uVar18;
  FabArray<amrex::FArrayBox> *this_00;
  undefined8 *puVar19;
  int iVar20;
  uint uVar21;
  long lVar22;
  double *pdVar23;
  long lVar24;
  double *pdVar25;
  long lVar26;
  long lVar27;
  long lVar28;
  long lVar29;
  long lVar30;
  int iVar31;
  long lVar32;
  long lVar33;
  long lVar34;
  long lVar35;
  long lVar36;
  long lVar37;
  long lVar38;
  long lVar39;
  double dVar40;
  double dVar41;
  double dVar42;
  double dVar43;
  double dVar44;
  double dVar45;
  double dVar46;
  Box local_514;
  double *local_4f8;
  double local_4f0;
  double local_4e8;
  double local_4e0;
  double local_4d8;
  double local_4d0;
  uint local_4c8;
  int local_4c4;
  MLNodeLaplacian *local_4c0;
  double *local_4b8;
  double local_4b0;
  double *local_4a8;
  double *local_4a0;
  long local_498;
  double *local_490;
  double *local_488;
  double local_480;
  long local_478;
  double *local_470;
  double *local_468;
  int *local_460;
  double local_458;
  double local_450;
  double local_448;
  double *local_440;
  double local_438;
  double local_430;
  double *local_428;
  int local_420;
  int local_41c;
  int local_418;
  int local_414;
  int local_410;
  int local_40c;
  Array4<const_int> local_408;
  Array4<double> local_3c8;
  Array4<const_double> local_388;
  undefined8 *local_348;
  long local_340;
  Array4<const_double> local_338;
  double local_2f8;
  undefined8 uStack_2f0;
  double local_2e8;
  undefined8 uStack_2e0;
  double local_2d8;
  undefined8 uStack_2d0;
  double local_2c8;
  undefined8 uStack_2c0;
  long local_2b8;
  long local_2b0;
  FabArray<amrex::IArrayBox> *local_2a8;
  FabArray<amrex::FArrayBox> *local_2a0;
  FabArray<amrex::FArrayBox> *local_298;
  ulong local_290;
  long local_280;
  long local_270;
  int *local_268;
  double *local_260;
  ulong local_258;
  long local_250;
  long local_248;
  long local_240;
  long local_238;
  long local_230;
  long local_228;
  long local_220;
  long local_218;
  double *local_210;
  double *local_208;
  double *local_200;
  long local_1f8;
  long local_1f0;
  Real f2x2ymz;
  undefined8 uStack_1e0;
  Real f2xmy2z;
  undefined8 uStack_1d0;
  Real fm2xm2y4z;
  undefined8 uStack_1c0;
  Real fm2x4ym2z;
  undefined8 uStack_1b0;
  Real f4xm2ym2z;
  undefined8 uStack_1a0;
  Real fmx2y2z;
  undefined8 uStack_190;
  Real fxyz;
  undefined8 uStack_180;
  double local_178;
  undefined8 uStack_170;
  double local_168;
  undefined8 uStack_160;
  double local_158;
  undefined8 uStack_150;
  Real facy;
  undefined8 uStack_140;
  Real facx;
  undefined8 uStack_130;
  Real facz;
  undefined8 uStack_120;
  MFIter mfi;
  Array4<const_double> local_b0;
  Array4<const_double> local_70;
  
  local_2b0 = (long)mglev;
  local_348 = (undefined8 *)
              (local_2b0 * 0x18 +
              *(long *)&(this->m_sigma).
                        super_vector<amrex::Vector<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>,_std::allocator<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>_>_>,_std::allocator<amrex::Vector<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>,_std::allocator<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>_>_>_>_>
                        .
                        super__Vector_base<amrex::Vector<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>,_std::allocator<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>_>_>,_std::allocator<amrex::Vector<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>,_std::allocator<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[amrlev].
                        super_vector<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>,_std::allocator<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>_>_>
                        .
                        super__Vector_base<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>,_std::allocator<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>_>_>
              );
  local_2b8 = *(long *)&(this->m_stencil).
                        super_vector<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>_>_>
                        .
                        super__Vector_base<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[amrlev].
                        super_vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                        .
                        super__Vector_base<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
  ;
  lVar22 = *(long *)&(this->super_MLNodeLinOp).super_MLLinOp.m_geom.
                     super_vector<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                     .
                     super__Vector_base<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[amrlev].
                     super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
                     super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>;
  lVar32 = local_2b0 * 200;
  dVar46 = *(double *)(lVar22 + 0x38 + lVar32);
  dVar42 = *(double *)(lVar22 + 0x40 + lVar32);
  dVar2 = *(double *)(lVar22 + 0x48 + lVar32);
  local_2a8 = *(FabArray<amrex::IArrayBox> **)
               (*(long *)&(this->super_MLNodeLinOp).m_dirichlet_mask.
                          super_vector<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>_>_>
                          .
                          super__Vector_base<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[amrlev].
                          super_vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
                          .
                          super__Vector_base<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
               + local_2b0 * 8);
  local_4c0 = this;
  local_420 = mglev;
  local_2a0 = &out->super_FabArray<amrex::FArrayBox>;
  local_298 = &in->super_FabArray<amrex::FArrayBox>;
  MFIter::MFIter(&mfi,(FabArrayBase *)out,true);
  facx = dVar46 * 0.027777777777777776 * dVar46;
  facy = dVar42 * 0.027777777777777776 * dVar42;
  facz = dVar2 * 0.027777777777777776 * dVar2;
  fxyz = facx + facy + facz;
  uStack_180 = 0;
  local_2c8 = -facx;
  uStack_2c0 = 0x8000000000000000;
  local_2d8 = facy + facy;
  local_2e8 = facz + facz;
  fmx2y2z = (local_2d8 - facx) + local_2e8;
  uStack_190 = 0;
  local_168 = -facy;
  uStack_160 = 0x8000000000000000;
  local_178 = facx + facx;
  f4xm2ym2z = (facx * 4.0 - local_2d8) + facz * -2.0;
  uStack_1a0 = 0;
  uStack_130 = 0;
  fm2x4ym2z = facy * 4.0 + facx * -2.0 + facz * -2.0;
  uStack_1b0 = 0;
  fm2xm2y4z = facz * 4.0 + (facx * -2.0 - local_2d8);
  uStack_1c0 = 0;
  uStack_140 = 0;
  uStack_2e0 = 0;
  f2xmy2z = (local_178 - facy) + local_2e8;
  uStack_1d0 = 0;
  uStack_170 = 0;
  uStack_2d0 = 0;
  f2x2ymz = (local_178 + local_2d8) - facz;
  uStack_1e0 = 0;
  uStack_120 = 0;
  local_158 = -facz;
  uStack_150 = 0x8000000000000000;
  while (mfi.currentIndex < mfi.endIndex) {
    MFIter::tilebox(&local_514,&mfi);
    FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>(&local_388,local_298,&mfi);
    FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>(&local_3c8,local_2a0,&mfi);
    FabArray<amrex::IArrayBox>::const_array<amrex::IArrayBox,_0>(&local_408,local_2a8,&mfi);
    if ((local_4c0->super_MLNodeLinOp).m_coarsening_strategy == RAP) {
      FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                (&local_338,*(FabArray<amrex::FArrayBox> **)(local_2b8 + local_2b0 * 8),&mfi);
      local_488 = (double *)(long)local_514.smallend.vect[0];
      local_4a8 = (double *)CONCAT44(local_4a8._4_4_,local_514.smallend.vect[1]);
      local_490 = (double *)(ulong)(uint)local_514.bigend.vect[0];
      local_4a0 = (double *)CONCAT44(local_4a0._4_4_,local_514.bigend.vect[2]);
      local_498 = CONCAT44(local_498._4_4_,local_514.bigend.vect[1]);
      uVar21 = local_514.smallend.vect[2];
      while (uVar18 = uVar21, (int)uVar18 <= local_514.bigend.vect[2]) {
        iVar20 = uVar18 - 1;
        local_458 = (double)CONCAT44(local_458._4_4_,iVar20);
        uVar21 = uVar18 + 1;
        local_4b0 = (double)CONCAT44(local_4b0._4_4_,uVar21);
        local_468 = (double *)(long)local_408.begin.y;
        local_460 = local_408.p + ((long)(int)uVar18 - (long)local_408.begin.z) * local_408.kstride;
        local_470 = (double *)local_408.jstride;
        local_478 = (long)local_3c8.begin.y;
        local_480 = (double)local_3c8.jstride;
        local_4b8 = local_3c8.p + ((long)(int)uVar18 - (long)local_3c8.begin.z) * local_3c8.kstride;
        iVar31 = local_514.smallend.vect[1];
        while (local_450 = (double)(ulong)uVar18, iVar31 <= local_514.bigend.vect[1]) {
          if (local_514.bigend.vect[0] < local_514.smallend.vect[0]) {
            iVar31 = iVar31 + 1;
          }
          else {
            lVar22 = (long)iVar31;
            iVar1 = iVar31 + 1;
            lVar37 = (iVar31 - local_388.begin.y) * local_388.jstride;
            lVar33 = (iVar31 - local_338.begin.y) * local_338.jstride;
            lVar35 = ((iVar31 + -1) - local_338.begin.y) * local_338.jstride;
            local_448 = (double)CONCAT44(local_448._4_4_,iVar1);
            lVar34 = ((iVar31 + -1) - local_388.begin.y) * local_388.jstride;
            local_4f0 = (double)((int)(uVar18 - local_338.begin.z) * local_338.kstride);
            local_4f8 = local_388.p + (iVar1 - local_388.begin.y) * local_388.jstride;
            local_4d0 = (double)((iVar20 - local_338.begin.z) * local_338.kstride);
            lVar32 = (int)(uVar18 - local_388.begin.z) * local_388.kstride;
            local_440 = (double *)((iVar20 - local_388.begin.z) * local_388.kstride);
            local_2f8 = (double)((int)(uVar21 - local_388.begin.z) * local_388.kstride);
            local_4d8 = (double)(long)local_338.begin.x;
            local_4e0 = (double)local_338.nstride;
            local_428 = (double *)(local_338.nstride * 2);
            local_430 = (double)(local_338.nstride * 4);
            local_438 = (double)(local_338.nstride * 5);
            local_4e8 = (double)(local_338.nstride * 7);
            pdVar25 = local_488;
            do {
              if (local_460[(long)pdVar25 +
                            ((lVar22 - (long)local_468) * local_408.jstride -
                            (long)local_408.begin.x)] == 0) {
                lVar29 = (long)pdVar25 - (long)local_388.begin.x;
                lVar28 = (long)pdVar25 + (-1 - (long)local_388.begin.x);
                lVar30 = -1 - (long)local_4d8;
                lVar27 = (long)(((int)pdVar25 + 1) - local_388.begin.x);
                pdVar23 = local_338.p + (long)pdVar25 + lVar33 + ((long)local_4f0 - (long)local_4d8)
                ;
                dVar46 = local_4f8[lVar27 + (long)local_2f8] * pdVar23[local_338.nstride * 7] +
                         local_4f8[lVar28 + (long)local_2f8] *
                         local_338.p
                         [(long)pdVar25 + lVar33 + (long)local_4f0 + local_338.nstride * 7 + lVar30]
                         + local_388.p[lVar34 + lVar27 + (long)local_2f8] *
                           local_338.p
                           [(long)pdVar25 +
                            lVar35 + (((long)local_4f0 + local_338.nstride * 7) - (long)local_4d8)]
                           + local_388.p[lVar34 + lVar28 + (long)local_2f8] *
                             local_338.p
                             [(long)pdVar25 +
                              lVar35 + (long)local_4f0 + local_338.nstride * 7 + lVar30] +
                             local_4f8[lVar27 + (long)local_440] *
                             local_338.p
                             [(long)pdVar25 +
                              lVar33 + (((long)local_4d0 + local_338.nstride * 7) - (long)local_4d8)
                             ] + local_4f8[lVar28 + (long)local_440] *
                                 local_338.p
                                 [(long)pdVar25 +
                                  lVar33 + (long)local_4d0 + local_338.nstride * 7 + lVar30] +
                                 local_388.p[(long)local_440 + lVar34 + lVar27] *
                                 local_338.p
                                 [(long)pdVar25 +
                                  lVar35 + (((long)local_4d0 + local_338.nstride * 7) -
                                           (long)local_4d8)] +
                                 local_388.p[(long)local_440 + lVar34 + lVar28] *
                                 local_338.p
                                 [(long)pdVar25 +
                                  lVar35 + (long)local_4d0 + local_338.nstride * 7 + lVar30] +
                                 local_4f8[lVar29 + (long)local_2f8] *
                                 pdVar23[local_338.nstride * 6] +
                                 local_388.p[lVar34 + lVar29 + (long)local_2f8] *
                                 local_338.p
                                 [(long)pdVar25 +
                                  lVar35 + (((long)local_4f0 + local_338.nstride * 6) -
                                           (long)local_4d8)] +
                                 local_4f8[lVar29 + (long)local_440] *
                                 local_338.p
                                 [(long)pdVar25 +
                                  lVar33 + (((long)local_4d0 + local_338.nstride * 6) -
                                           (long)local_4d8)] +
                                 local_388.p[(long)local_440 + lVar34 + lVar29] *
                                 local_338.p
                                 [(long)pdVar25 +
                                  lVar35 + (((long)local_4d0 + local_338.nstride * 6) -
                                           (long)local_4d8)] +
                                 local_388.p[lVar37 + lVar27 + (long)local_2f8] *
                                 pdVar23[local_338.nstride * 5] +
                                 local_388.p[lVar37 + lVar28 + (long)local_2f8] *
                                 local_338.p
                                 [(long)pdVar25 +
                                  lVar33 + (long)local_4f0 + local_338.nstride * 5 + lVar30] +
                                 local_388.p[(long)local_440 + lVar37 + lVar27] *
                                 local_338.p
                                 [(long)pdVar25 +
                                  lVar33 + (((long)local_4d0 + local_338.nstride * 5) -
                                           (long)local_4d8)] +
                                 local_388.p[(long)local_440 + lVar37 + lVar28] *
                                 local_338.p
                                 [(long)pdVar25 +
                                  lVar33 + (long)local_4d0 + local_338.nstride * 5 + lVar30] +
                                 local_4f8[lVar27 + lVar32] * pdVar23[local_338.nstride * 4] +
                                 local_4f8[lVar28 + lVar32] *
                                 local_338.p
                                 [(long)pdVar25 +
                                  lVar33 + (long)local_4f0 + local_338.nstride * 4 + lVar30] +
                                 local_388.p[lVar34 + lVar27 + lVar32] *
                                 local_338.p
                                 [(long)pdVar25 +
                                  lVar35 + (((long)local_4f0 + local_338.nstride * 4) -
                                           (long)local_4d8)] +
                                 local_388.p[lVar34 + lVar28 + lVar32] *
                                 local_338.p
                                 [(long)pdVar25 +
                                  lVar35 + (long)local_4f0 + local_338.nstride * 4 + lVar30] +
                                 local_388.p[lVar37 + lVar29 + (long)local_2f8] *
                                 pdVar23[local_338.nstride * 3] +
                                 local_388.p[(long)local_440 + lVar37 + lVar29] *
                                 local_338.p
                                 [(long)pdVar25 +
                                  lVar33 + (((long)local_4d0 + local_338.nstride * 3) -
                                           (long)local_4d8)] +
                                 local_4f8[lVar29 + lVar32] * pdVar23[local_338.nstride * 2] +
                                 local_388.p[lVar34 + lVar29 + lVar32] *
                                 local_338.p
                                 [(long)pdVar25 +
                                  lVar35 + (((long)local_4f0 + local_338.nstride * 2) -
                                           (long)local_4d8)] +
                                 local_388.p[lVar37 + lVar27 + lVar32] * pdVar23[local_338.nstride]
                                 + local_388.p[lVar37 + lVar29 + lVar32] * *pdVar23 +
                                   local_388.p[lVar37 + lVar28 + lVar32] *
                                   local_338.p
                                   [(long)pdVar25 +
                                    lVar33 + (long)local_4f0 + local_338.nstride + lVar30];
              }
              else {
                dVar46 = 0.0;
              }
              pdVar23 = (double *)((long)pdVar25 + 1);
              local_4b8[(long)pdVar25 +
                        ((lVar22 - local_478) * local_3c8.jstride - (long)local_3c8.begin.x)] =
                   dVar46;
              pdVar25 = pdVar23;
              iVar31 = iVar1;
            } while ((int)pdVar23 != local_514.bigend.vect[0] + 1U);
          }
        }
      }
    }
    else {
      this_00 = (FabArray<amrex::FArrayBox> *)*local_348;
      if (this_00 == (FabArray<amrex::FArrayBox> *)0x0) {
        dVar46 = local_4c0->m_const_sigma;
        uVar21 = local_514.smallend.vect[2];
        while (uVar18 = uVar21, (int)uVar18 <= local_514.bigend.vect[2]) {
          iVar31 = local_514.smallend.vect[1];
          while (uVar21 = uVar18 + 1, iVar31 <= local_514.bigend.vect[1]) {
            if (local_514.bigend.vect[0] < local_514.smallend.vect[0]) {
              iVar31 = iVar31 + 1;
            }
            else {
              lVar32 = (long)iVar31;
              iVar20 = iVar31 + 1;
              lVar30 = (iVar31 - local_388.begin.y) * local_388.jstride;
              lVar33 = (int)(uVar18 - local_388.begin.z) * local_388.kstride;
              lVar37 = (~local_388.begin.y + iVar31) * local_388.jstride;
              lVar27 = (iVar20 - local_388.begin.y) * local_388.jstride;
              lVar35 = (int)(~local_388.begin.z + uVar18) * local_388.kstride;
              lVar34 = (int)((uVar18 + 1) - local_388.begin.z) * local_388.kstride;
              lVar22 = (long)local_514.smallend.vect[0];
              do {
                if (local_408.p
                    [((long)(int)uVar18 - (long)local_408.begin.z) * local_408.kstride +
                     (lVar32 - local_408.begin.y) * local_408.jstride + (lVar22 - local_408.begin.x)
                    ] == 0) {
                  lVar38 = (long)(~local_388.begin.x + (int)lVar22);
                  lVar28 = (long)(((int)lVar22 + 1) - local_388.begin.x);
                  lVar29 = lVar22 - local_388.begin.x;
                  dVar42 = ((local_388.p[lVar30 + lVar29 + lVar35] * 4.0 +
                            local_388.p[lVar30 + lVar29 + lVar34] * 4.0) * fm2xm2y4z +
                           (local_388.p[lVar37 + lVar29 + lVar33] * 4.0 +
                           local_388.p[lVar27 + lVar29 + lVar33] * 4.0) * fm2x4ym2z +
                           (local_388.p[lVar30 + lVar38 + lVar33] * 4.0 +
                           local_388.p[lVar30 + lVar28 + lVar33] * 4.0) * f4xm2ym2z +
                           (local_388.p[lVar27 + lVar28 + lVar33] +
                            local_388.p[lVar27 + lVar28 + lVar33] +
                           local_388.p[lVar27 + lVar38 + lVar33] +
                           local_388.p[lVar27 + lVar38 + lVar33] +
                           local_388.p[lVar37 + lVar38 + lVar33] +
                           local_388.p[lVar37 + lVar38 + lVar33] +
                           local_388.p[lVar37 + lVar28 + lVar33] +
                           local_388.p[lVar37 + lVar28 + lVar33]) * f2x2ymz +
                           (local_388.p[lVar30 + lVar28 + lVar34] +
                            local_388.p[lVar30 + lVar28 + lVar34] +
                           local_388.p[lVar30 + lVar38 + lVar34] +
                           local_388.p[lVar30 + lVar38 + lVar34] +
                           local_388.p[lVar30 + lVar38 + lVar35] +
                           local_388.p[lVar30 + lVar38 + lVar35] +
                           local_388.p[lVar30 + lVar28 + lVar35] +
                           local_388.p[lVar30 + lVar28 + lVar35]) * f2xmy2z +
                           (local_388.p[lVar27 + lVar29 + lVar34] +
                            local_388.p[lVar27 + lVar29 + lVar34] +
                           local_388.p[lVar37 + lVar29 + lVar34] +
                           local_388.p[lVar37 + lVar29 + lVar34] +
                           local_388.p[lVar37 + lVar29 + lVar35] +
                           local_388.p[lVar37 + lVar29 + lVar35] +
                           local_388.p[lVar27 + lVar29 + lVar35] +
                           local_388.p[lVar27 + lVar29 + lVar35]) * fmx2y2z +
                           local_388.p[lVar30 + lVar29 + lVar33] * -4.0 * fxyz * 8.0 +
                           (local_388.p[lVar37 + lVar38 + lVar35] +
                            local_388.p[lVar37 + lVar28 + lVar35] +
                            local_388.p[lVar27 + lVar38 + lVar35] +
                            local_388.p[lVar27 + lVar28 + lVar35] +
                            local_388.p[lVar37 + lVar38 + lVar34] +
                            local_388.p[lVar37 + lVar28 + lVar34] +
                            local_388.p[lVar27 + lVar38 + lVar34] +
                           local_388.p[lVar27 + lVar28 + lVar34]) * fxyz) * dVar46;
                }
                else {
                  dVar42 = 0.0;
                }
                lVar28 = lVar22 + 1;
                local_3c8.p
                [((long)(int)uVar18 - (long)local_3c8.begin.z) * local_3c8.kstride +
                 (lVar32 - local_3c8.begin.y) * local_3c8.jstride + (lVar22 - local_3c8.begin.x)] =
                     dVar42;
                lVar22 = lVar28;
                iVar31 = iVar20;
              } while ((int)lVar28 != local_514.bigend.vect[0] + 1U);
            }
          }
        }
      }
      else if (((local_420 < 1) || (local_4c0->m_use_harmonic_average == false)) &&
              (local_4c0->m_use_mapped != true)) {
        FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>(&local_338,this_00,&mfi);
        local_4e0 = (double)CONCAT44(local_4e0._4_4_,local_514.smallend.vect[1]);
        local_4f8 = (double *)(ulong)(uint)local_514.bigend.vect[0];
        local_4d8 = (double)CONCAT44(local_4d8._4_4_,local_514.bigend.vect[2]);
        local_4d0 = (double)CONCAT44(local_4d0._4_4_,local_514.bigend.vect[1]);
        uVar21 = local_514.smallend.vect[2];
        while (uVar18 = uVar21, (int)uVar18 <= local_514.bigend.vect[2]) {
          local_4f0 = (double)local_3c8.jstride;
          iVar31 = local_514.smallend.vect[1];
          while (uVar21 = uVar18 + 1, iVar31 <= local_514.bigend.vect[1]) {
            if (local_514.bigend.vect[0] < local_514.smallend.vect[0]) {
              iVar31 = iVar31 + 1;
            }
            else {
              lVar33 = (long)iVar31;
              iVar20 = iVar31 + 1;
              lVar27 = (iVar31 - local_388.begin.y) * local_388.jstride;
              lVar38 = ((iVar31 + -1) - local_338.begin.y) * local_338.jstride;
              lVar34 = (iVar31 - local_338.begin.y) * local_338.jstride;
              lVar30 = (int)((uVar18 - 1) - local_338.begin.z) * local_338.kstride;
              lVar35 = (int)(uVar18 - local_338.begin.z) * local_338.kstride;
              lVar32 = ((iVar31 + -1) - local_388.begin.y) * local_388.jstride;
              lVar28 = (iVar20 - local_388.begin.y) * local_388.jstride;
              lVar37 = (int)(uVar18 - local_388.begin.z) * local_388.kstride;
              lVar39 = (int)((uVar18 - 1) - local_388.begin.z) * local_388.kstride;
              lVar29 = (int)((uVar18 + 1) - local_388.begin.z) * local_388.kstride;
              lVar22 = (long)local_514.smallend.vect[0];
              do {
                if (local_408.p
                    [((long)(int)uVar18 - (long)local_408.begin.z) * local_408.kstride +
                     (lVar33 - local_408.begin.y) * local_408.jstride + (lVar22 - local_408.begin.x)
                    ] == 0) {
                  lVar24 = lVar22 - local_388.begin.x;
                  lVar26 = (lVar22 + -1) - (long)local_338.begin.x;
                  dVar46 = local_338.p[lVar38 + lVar26 + lVar30];
                  lVar36 = lVar22 - local_338.begin.x;
                  dVar42 = local_338.p[lVar38 + lVar36 + lVar30];
                  dVar43 = dVar46 + dVar42;
                  dVar2 = local_338.p[lVar34 + lVar26 + lVar30];
                  dVar3 = local_338.p[lVar34 + lVar36 + lVar30];
                  dVar41 = dVar43 + dVar2 + dVar3;
                  dVar4 = local_338.p[lVar38 + lVar26 + lVar35];
                  dVar5 = local_338.p[lVar38 + lVar36 + lVar35];
                  dVar6 = local_338.p[lVar34 + lVar26 + lVar35];
                  dVar7 = local_338.p[lVar34 + lVar36 + lVar35];
                  lVar36 = (lVar22 + -1) - (long)local_388.begin.x;
                  lVar26 = (long)(((int)lVar22 + 1) - local_388.begin.x);
                  dVar46 = (dVar41 * local_388.p[lVar27 + lVar24 + lVar39] +
                           (dVar4 + dVar5 + dVar6 + dVar7) * local_388.p[lVar27 + lVar24 + lVar29])
                           * fm2xm2y4z +
                           ((dVar43 + dVar4 + dVar5) * local_388.p[lVar32 + lVar24 + lVar37] +
                           (dVar2 + dVar3 + dVar6 + dVar7) * local_388.p[lVar28 + lVar24 + lVar37])
                           * fm2x4ym2z +
                           ((dVar46 + dVar2 + dVar4 + dVar6) * local_388.p[lVar27 + lVar36 + lVar37]
                           + (dVar42 + dVar3 + dVar5 + dVar7) *
                             local_388.p[lVar27 + lVar26 + lVar37]) * f4xm2ym2z +
                           ((dVar3 + dVar7) * local_388.p[lVar28 + lVar26 + lVar37] +
                           (dVar2 + dVar6) * local_388.p[lVar28 + lVar36 + lVar37] +
                           (dVar46 + dVar4) * local_388.p[lVar32 + lVar36 + lVar37] +
                           (dVar42 + dVar5) * local_388.p[lVar32 + lVar26 + lVar37]) * f2x2ymz +
                           ((dVar5 + dVar7) * local_388.p[lVar27 + lVar26 + lVar29] +
                           (dVar4 + dVar6) * local_388.p[lVar27 + lVar36 + lVar29] +
                           local_388.p[lVar27 + lVar36 + lVar39] * (dVar46 + dVar2) +
                           local_388.p[lVar27 + lVar26 + lVar39] * (dVar42 + dVar3)) * f2xmy2z +
                           ((dVar6 + dVar7) * local_388.p[lVar28 + lVar24 + lVar29] +
                           local_388.p[lVar32 + lVar24 + lVar29] * (dVar4 + dVar5) +
                           local_388.p[lVar32 + lVar24 + lVar39] * dVar43 +
                           local_388.p[lVar28 + lVar24 + lVar39] * (dVar2 + dVar3)) * fmx2y2z +
                           (local_388.p[lVar28 + lVar26 + lVar29] * dVar7 +
                           local_388.p[lVar28 + lVar36 + lVar29] * dVar6 +
                           local_388.p[lVar32 + lVar26 + lVar29] * dVar5 +
                           local_388.p[lVar32 + lVar36 + lVar29] * dVar4 +
                           local_388.p[lVar28 + lVar26 + lVar39] * dVar3 +
                           local_388.p[lVar28 + lVar36 + lVar39] * dVar2 +
                           local_388.p[lVar32 + lVar36 + lVar39] * dVar46 +
                           local_388.p[lVar32 + lVar26 + lVar39] * dVar42) * fxyz +
                           (dVar41 + dVar4 + dVar5 + dVar6 + dVar7) *
                           local_388.p[lVar27 + lVar24 + lVar37] * -4.0 * fxyz;
                }
                else {
                  dVar46 = 0.0;
                }
                lVar24 = lVar22 + 1;
                local_3c8.p
                [((long)(int)uVar18 - (long)local_3c8.begin.z) * local_3c8.kstride +
                 (lVar33 - local_3c8.begin.y) * local_3c8.jstride + (lVar22 - local_3c8.begin.x)] =
                     dVar46;
                lVar22 = lVar24;
                iVar31 = iVar20;
              } while ((int)lVar24 != local_514.bigend.vect[0] + 1U);
            }
          }
        }
      }
      else {
        FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>(&local_338,this_00,&mfi);
        puVar19 = local_348;
        FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                  (&local_70,(FabArray<amrex::FArrayBox> *)local_348[1],&mfi);
        FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                  (&local_b0,(FabArray<amrex::FArrayBox> *)puVar19[2],&mfi);
        local_340 = (long)local_514.smallend.vect[0];
        local_41c = local_514.smallend.vect[1];
        local_290 = (ulong)(uint)local_514.bigend.vect[0];
        local_418 = local_514.bigend.vect[2];
        local_40c = local_514.bigend.vect[0] + 1;
        local_414 = local_514.bigend.vect[1];
        uVar21 = local_514.smallend.vect[2];
        while (uVar18 = uVar21, (int)uVar18 <= local_514.bigend.vect[2]) {
          local_410 = uVar18 - 1;
          local_4c8 = uVar18 + 1;
          local_250 = (long)local_408.begin.x;
          local_270 = (long)local_408.begin.y;
          local_268 = local_408.p +
                      ((long)(int)uVar18 - (long)local_408.begin.z) * local_408.kstride;
          local_4b8 = (double *)(long)local_3c8.begin.x;
          local_280 = (long)local_3c8.begin.y;
          local_260 = local_3c8.p +
                      ((long)(int)uVar18 - (long)local_3c8.begin.z) * local_3c8.kstride;
          iVar31 = local_514.smallend.vect[1];
          while (uVar21 = local_4c8, local_258 = (ulong)uVar18, iVar31 <= local_514.bigend.vect[1])
          {
            if (local_514.bigend.vect[0] < local_514.smallend.vect[0]) {
              iVar31 = iVar31 + 1;
            }
            else {
              lVar32 = (long)iVar31;
              iVar20 = iVar31 + -1;
              local_4c4 = iVar31 + 1;
              local_460 = (int *)((local_410 - local_338.begin.z) * local_338.kstride);
              local_468 = local_338.p + (iVar20 - local_338.begin.y) * local_338.jstride;
              local_470 = local_338.p + (iVar31 - local_338.begin.y) * local_338.jstride;
              local_478 = (int)(uVar18 - local_338.begin.z) * local_338.kstride;
              local_480 = (double)((local_410 - local_70.begin.z) * local_70.kstride);
              local_488 = local_70.p + (iVar20 - local_70.begin.y) * local_70.jstride;
              local_490 = local_70.p + (iVar31 - local_70.begin.y) * local_70.jstride;
              local_498 = (int)(uVar18 - local_70.begin.z) * local_70.kstride;
              local_4a0 = local_b0.p + (iVar20 - local_b0.begin.y) * local_b0.jstride;
              local_4a8 = local_b0.p + (iVar31 - local_b0.begin.y) * local_b0.jstride;
              local_1f0 = (local_410 - local_b0.begin.z) * local_b0.kstride;
              local_1f8 = (int)(uVar18 - local_b0.begin.z) * local_b0.kstride;
              local_4f8 = local_388.p + (iVar31 - local_388.begin.y) * local_388.jstride;
              local_200 = local_388.p + (iVar20 - local_388.begin.y) * local_388.jstride;
              local_208 = local_388.p + (local_4c4 - local_388.begin.y) * local_388.jstride;
              local_238 = (int)(uVar18 - local_388.begin.z) * local_388.kstride;
              local_240 = (local_410 - local_388.begin.z) * local_388.kstride;
              local_248 = (int)(local_4c8 - local_388.begin.z) * local_388.kstride;
              local_210 = local_260 + (lVar32 - local_280) * local_3c8.jstride;
              local_218 = (long)local_388.begin.x;
              local_220 = (long)local_338.begin.x;
              local_228 = (long)local_70.begin.x;
              local_230 = (long)local_b0.begin.x;
              lVar22 = local_340;
              do {
                if (local_268[(lVar32 - local_270) * local_408.jstride + (lVar22 - local_250)] == 0)
                {
                  lVar33 = lVar22 + -1;
                  lVar34 = lVar33 - local_220;
                  dVar46 = local_468[lVar34 + (long)local_460];
                  lVar35 = lVar22 - local_220;
                  local_438 = local_468[lVar35 + (long)local_460];
                  dVar40 = dVar46 + local_438;
                  dVar42 = local_470[lVar34 + (long)local_460];
                  dVar2 = local_470[lVar35 + (long)local_460];
                  local_4d0 = dVar40 + dVar42 + dVar2;
                  dVar3 = local_468[lVar34 + local_478];
                  local_4f0 = local_468[lVar35 + local_478];
                  dVar4 = local_470[lVar34 + local_478];
                  dVar5 = local_470[lVar35 + local_478];
                  lVar34 = lVar33 - local_228;
                  dVar6 = local_488[lVar34 + (long)local_480];
                  lVar35 = lVar22 - local_228;
                  dVar7 = local_488[lVar35 + (long)local_480];
                  dVar44 = dVar6 + dVar7;
                  dVar41 = local_490[lVar34 + (long)local_480];
                  dVar43 = local_490[lVar35 + (long)local_480];
                  local_4d8 = dVar44 + dVar41 + dVar43;
                  dVar8 = local_488[lVar34 + local_498];
                  dVar9 = local_488[lVar35 + local_498];
                  dVar10 = local_490[lVar34 + local_498];
                  dVar11 = local_490[lVar35 + local_498];
                  lVar34 = lVar33 - local_230;
                  lVar35 = lVar22 - local_230;
                  dVar12 = local_4a0[lVar34 + local_1f0];
                  local_430 = local_4a0[lVar35 + local_1f0];
                  dVar45 = dVar12 + local_430;
                  dVar13 = local_4a8[lVar34 + local_1f0];
                  dVar14 = local_4a8[lVar35 + local_1f0];
                  local_4e0 = dVar45 + dVar13 + dVar14;
                  local_458 = local_4a0[lVar34 + local_1f8];
                  dVar15 = local_4a0[lVar35 + local_1f8];
                  dVar16 = local_4a8[lVar34 + local_1f8];
                  dVar17 = local_4a8[lVar35 + local_1f8];
                  lVar35 = lVar22 - local_218;
                  local_428 = local_4f8 + lVar35;
                  lVar33 = lVar33 - local_218;
                  lVar34 = (long)(((int)lVar22 + 1) - local_388.begin.x);
                  local_440 = local_200 + lVar34;
                  local_2f8 = (facz * dVar17 + facx * dVar5 + facy * dVar11) *
                              local_208[lVar34 + local_248] +
                              (facz * dVar16 + facx * dVar4 + facy * dVar10) *
                              local_208[lVar33 + local_248] +
                              (facz * dVar15 + facx * local_4f0 + facy * dVar9) *
                              local_440[local_248] +
                              (facz * local_458 + facx * dVar3 + facy * dVar8) *
                              local_200[lVar33 + local_248] +
                              (facz * dVar14 + facx * dVar2 + facy * dVar43) *
                              local_208[lVar34 + local_240] +
                              (facz * dVar13 + facx * dVar42 + facy * dVar41) *
                              local_208[lVar33 + local_240] +
                              (facz * dVar12 + facx * dVar46 + facy * dVar6) *
                              local_200[lVar33 + local_240] +
                              (facz * local_430 + facx * local_438 + facy * dVar7) *
                              local_440[local_240] +
                              ((local_4e0 + local_458 + dVar15 + dVar16 + dVar17) * facz +
                              (local_4d0 + dVar3 + local_4f0 + dVar4 + dVar5) * facx +
                              (local_4d8 + dVar8 + dVar9 + dVar10 + dVar11) * facy) *
                              local_428[local_238] * -4.0;
                  uStack_2f0 = uStack_120;
                  local_4b0 = dVar3 + dVar4;
                  local_4e8 = dVar3 + local_4f0 + dVar4;
                  local_450 = dVar6 + dVar41 + dVar8 + dVar10;
                  local_448 = dVar41 + dVar43 + dVar10;
                  dVar46 = ((local_458 + dVar15 + dVar16 + dVar17) * local_2e8 +
                           (local_4e8 + dVar5) * local_2c8 +
                           (dVar8 + dVar9 + dVar10 + dVar11) * local_168) *
                           (local_428[local_248] + local_428[local_248]) +
                           (local_4e0 * local_2e8 + local_4d0 * local_2c8 + local_4d8 * local_168) *
                           (local_428[local_240] + local_428[local_240]) +
                           ((dVar13 + dVar14 + dVar16 + dVar17) * local_158 +
                           (dVar42 + dVar2 + dVar4 + dVar5) * local_2c8 +
                           (local_448 + dVar11) * local_2d8) *
                           (local_208[lVar35 + local_238] + local_208[lVar35 + local_238]) +
                           ((dVar45 + local_458 + dVar15) * local_158 +
                           (dVar40 + dVar3 + local_4f0) * local_2c8 +
                           (dVar44 + dVar8 + dVar9) * local_2d8) *
                           (local_200[lVar35 + local_238] + local_200[lVar35 + local_238]) +
                           ((local_430 + dVar14 + dVar15 + dVar17) * local_158 +
                           (local_438 + dVar2 + local_4f0 + dVar5) * local_178 +
                           (dVar7 + dVar43 + dVar9 + dVar11) * local_168) *
                           (local_4f8[lVar34 + local_238] + local_4f8[lVar34 + local_238]) +
                           ((dVar12 + dVar13 + local_458 + dVar16) * local_158 +
                           (dVar46 + dVar42 + dVar3 + dVar4) * local_178 + local_450 * local_168) *
                           (local_4f8[lVar33 + local_238] + local_4f8[lVar33 + local_238]) +
                           ((dVar14 + dVar17) * local_158 +
                           (dVar2 + dVar5) * local_178 + (dVar43 + dVar11) * local_2d8) *
                           local_208[lVar34 + local_238] +
                           ((dVar13 + dVar16) * local_158 +
                           (dVar42 + dVar4) * local_178 + (dVar41 + dVar10) * local_2d8) *
                           local_208[lVar33 + local_238] +
                           ((local_430 + dVar15) * local_158 +
                           (local_438 + local_4f0) * local_178 + (dVar7 + dVar9) * local_2d8) *
                           local_440[local_238] +
                           ((dVar12 + local_458) * local_158 +
                           (dVar46 + dVar3) * local_178 + (dVar6 + dVar8) * local_2d8) *
                           local_200[lVar33 + local_238] +
                           ((dVar15 + dVar17) * local_2e8 +
                           (local_4f0 + dVar5) * local_178 + (dVar9 + dVar11) * local_168) *
                           local_4f8[lVar34 + local_248] +
                           ((local_458 + dVar16) * local_2e8 +
                           local_4b0 * local_178 + (dVar8 + dVar10) * local_168) *
                           local_4f8[lVar33 + local_248] +
                           (local_2e8 * (local_430 + dVar14) +
                           local_178 * (local_438 + dVar2) + (dVar7 + dVar43) * local_168) *
                           local_4f8[lVar34 + local_240] +
                           (local_2e8 * (dVar12 + dVar13) +
                           local_178 * (dVar46 + dVar42) + (dVar6 + dVar41) * local_168) *
                           local_4f8[lVar33 + local_240] +
                           ((dVar16 + dVar17) * local_2e8 +
                           (dVar4 + dVar5) * local_2c8 + (dVar10 + dVar11) * local_2d8) *
                           local_208[lVar35 + local_248] +
                           (local_2e8 * (local_458 + dVar15) +
                           local_2c8 * (dVar3 + local_4f0) + local_2d8 * (dVar8 + dVar9)) *
                           local_200[lVar35 + local_248] +
                           (local_2e8 * dVar45 + local_2c8 * dVar40 + local_2d8 * dVar44) *
                           local_200[lVar35 + local_240] +
                           (local_2e8 * (dVar13 + dVar14) +
                           local_2c8 * (dVar42 + dVar2) + local_2d8 * (dVar41 + dVar43)) *
                           local_208[lVar35 + local_240] + local_2f8;
                }
                else {
                  dVar46 = 0.0;
                }
                lVar33 = lVar22 + 1;
                local_210[lVar22 - (long)local_4b8] = dVar46;
                lVar22 = lVar33;
                iVar31 = local_4c4;
              } while ((int)lVar33 != local_40c);
            }
          }
        }
      }
    }
    MFIter::operator++(&mfi);
  }
  MFIter::~MFIter(&mfi);
  return;
}

Assistant:

void
MLNodeLaplacian::Fapply (int amrlev, int mglev, MultiFab& out, const MultiFab& in) const
{
    BL_PROFILE("MLNodeLaplacian::Fapply()");

    const auto& sigma = m_sigma[amrlev][mglev];
    const auto& stencil = m_stencil[amrlev][mglev];
    const auto dxinvarr = m_geom[amrlev][mglev].InvCellSizeArray();
#if (AMREX_SPACEDIM == 2)
    bool is_rz = m_is_rz;
#endif

    const iMultiFab& dmsk = *m_dirichlet_mask[amrlev][mglev];


#ifdef AMREX_USE_GPU
    if (Gpu::inLaunchRegion()) {
        auto xarr_ma = in.const_arrays();
        auto yarr_ma = out.arrays();
        auto dmskarr_ma = dmsk.const_arrays();

        if (m_coarsening_strategy == CoarseningStrategy::RAP)
        {
            auto stenarr_ma = stencil->const_arrays();
            ParallelFor(out, [=] AMREX_GPU_DEVICE(int box_no, int i, int j, int k) noexcept
            {
                yarr_ma[box_no](i,j,k) = mlndlap_adotx_sten(i,j,k,xarr_ma[box_no],stenarr_ma[box_no],dmskarr_ma[box_no]);
            });
        }
        else if (sigma[0] == nullptr)
        {
            Real const_sigma = m_const_sigma;
            ParallelFor(out, [=] AMREX_GPU_DEVICE(int box_no, int i, int j, int k) noexcept
            {
#if (AMREX_SPACEDIM == 2)
                yarr_ma[box_no](i,j,k) = mlndlap_adotx_c(i,j,k,xarr_ma[box_no],const_sigma,dmskarr_ma[box_no], is_rz, dxinvarr);
#else
                yarr_ma[box_no](i,j,k) = mlndlap_adotx_c(i,j,k,xarr_ma[box_no],const_sigma,dmskarr_ma[box_no], dxinvarr);
#endif
            });
        }
        else if ( (m_use_harmonic_average && mglev > 0) ||
                   m_use_mapped )
        {
            AMREX_D_TERM(MultiArray4<Real const> const& sxarr_ma = sigma[0]->const_arrays();,
                         MultiArray4<Real const> const& syarr_ma = sigma[1]->const_arrays();,
                         MultiArray4<Real const> const& szarr_ma = sigma[2]->const_arrays(););
            ParallelFor(out, [=] AMREX_GPU_DEVICE(int box_no, int i, int j, int k) noexcept
            {
#if (AMREX_SPACEDIM == 2)
                yarr_ma[box_no](i,j,k) = mlndlap_adotx_ha(i,j,k,xarr_ma[box_no],AMREX_D_DECL(sxarr_ma[box_no],syarr_ma[box_no],szarr_ma[box_no]), dmskarr_ma[box_no],
                                               is_rz, dxinvarr);
#else
                yarr_ma[box_no](i,j,k) = mlndlap_adotx_ha(i,j,k,xarr_ma[box_no],AMREX_D_DECL(sxarr_ma[box_no],syarr_ma[box_no],szarr_ma[box_no]), dmskarr_ma[box_no],
                                               dxinvarr);
#endif
            });
        }
        else
        {
            auto sarr_ma = sigma[0]->const_arrays();
            ParallelFor(out, [=] AMREX_GPU_DEVICE(int box_no, int i, int j, int k) noexcept
            {
#if (AMREX_SPACEDIM == 2)
                yarr_ma[box_no](i,j,k) = mlndlap_adotx_aa(i,j,k,xarr_ma[box_no],sarr_ma[box_no],dmskarr_ma[box_no], is_rz, dxinvarr);
#else
                yarr_ma[box_no](i,j,k) = mlndlap_adotx_aa(i,j,k,xarr_ma[box_no],sarr_ma[box_no],dmskarr_ma[box_no], dxinvarr);
#endif
            });
        }
        Gpu::streamSynchronize();
    } else
#endif
    {
#ifdef AMREX_USE_OMP
#pragma omp parallel
#endif
        for (MFIter mfi(out,TilingIfNotGPU()); mfi.isValid(); ++mfi)
        {
            const Box& bx = mfi.tilebox();
            Array4<Real const> const& xarr = in.const_array(mfi);
            Array4<Real> const& yarr = out.array(mfi);
            Array4<int const> const& dmskarr = dmsk.const_array(mfi);

            if (m_coarsening_strategy == CoarseningStrategy::RAP)
            {
                Array4<Real const> const& stenarr = stencil->const_array(mfi);
                amrex::LoopConcurrentOnCpu(bx, [&] (int i, int j, int k) noexcept
                {
                    yarr(i,j,k) = mlndlap_adotx_sten(i,j,k,xarr,stenarr,dmskarr);
                });
            }
            else if (sigma[0] == nullptr)
            {
                Real const_sigma = m_const_sigma;
#if (AMREX_SPACEDIM == 2)
                amrex::LoopConcurrentOnCpu(bx, [&] (int i, int j, int k) noexcept
                {
                    yarr(i,j,k) = mlndlap_adotx_c(i,j,k,xarr,const_sigma,dmskarr, is_rz, dxinvarr);
                });
#else
                amrex::LoopConcurrentOnCpu(bx, [&] (int i, int j, int k) noexcept
                {
                    yarr(i,j,k) = mlndlap_adotx_c(i,j,k,xarr,const_sigma,dmskarr, dxinvarr);
                });
#endif
            }
            else if ( (m_use_harmonic_average && mglev > 0) ||
                       m_use_mapped )
            {
                AMREX_D_TERM(Array4<Real const> const& sxarr = sigma[0]->const_array(mfi);,
                             Array4<Real const> const& syarr = sigma[1]->const_array(mfi);,
                             Array4<Real const> const& szarr = sigma[2]->const_array(mfi););
#if (AMREX_SPACEDIM == 2)
                amrex::LoopConcurrentOnCpu(bx, [&] (int i, int j, int k) noexcept
                {
                    yarr(i,j,k) = mlndlap_adotx_ha(i,j,k,xarr,AMREX_D_DECL(sxarr,syarr,szarr), dmskarr,
                                                   is_rz, dxinvarr);
                });
#else
                amrex::LoopConcurrentOnCpu(bx, [&] (int i, int j, int k) noexcept
                {
                    yarr(i,j,k) = mlndlap_adotx_ha(i,j,k,xarr,AMREX_D_DECL(sxarr,syarr,szarr), dmskarr,
                                                   dxinvarr);
                });
#endif
            }
            else
            {
                Array4<Real const> const& sarr = sigma[0]->const_array(mfi);
#if (AMREX_SPACEDIM == 2)
                amrex::LoopConcurrentOnCpu(bx, [&] (int i, int j, int k) noexcept
                {
                    yarr(i,j,k) = mlndlap_adotx_aa(i,j,k,xarr,sarr,dmskarr, is_rz, dxinvarr);
                });
#else
                amrex::LoopConcurrentOnCpu(bx, [&] (int i, int j, int k) noexcept
                {
                    yarr(i,j,k) = mlndlap_adotx_aa(i,j,k,xarr,sarr,dmskarr, dxinvarr);
                });
#endif
           }
        }
    }
}